

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

string * stop_bits_to_text_abi_cxx11_(string *__return_storage_ptr__,stop_bits b)

{
  type tVar1;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  stop_bits local_14;
  string *psStack_10;
  stop_bits b_local;
  
  local_14.value_ = b.value_;
  psStack_10 = __return_storage_ptr__;
  tVar1 = boost::asio::serial_port_base::stop_bits::value(&local_14);
  if (tVar1 == one) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"1",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (tVar1 == onepointfive) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"1.5",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    if (tVar1 != two) {
      __assert_fail("!\"can\'t be\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                    ,0x62,"std::string stop_bits_to_text(boost::asio::serial_port_base::stop_bits)")
      ;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"2",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stop_bits_to_text( boost::asio::serial_port_base::stop_bits b )
{
    using type = boost::asio::serial_port_base::stop_bits::type;

    switch ( b.value() )
    {
        case type::one:
            return "1";
        case type::onepointfive:
            return "1.5";
        case type::two:
            return "2";
    }

    assert( !"can't be" );
}